

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_test.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_42fe24::ConvolveTestBase::SpeedTest(ConvolveTestBase *this)

{
  uint output_width;
  uint output_height;
  int16_t *piVar1;
  ConvolveFunc p_Var2;
  bool bVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  undefined8 uVar6;
  ushort uVar7;
  uint32_t uVar8;
  uint8_t *src_ptr;
  uint8_t *puVar9;
  ulong uVar10;
  ParamType *pPVar11;
  long lVar12;
  byte bVar13;
  int iVar14;
  uint uVar15;
  uint8_t *puVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  uint16_t in_FPULastInstructionOpcode;
  undefined8 in_FPUInstructionPointer;
  uint output_height_00;
  ACMRandom prng;
  RegisterStateCheckMMX reg_check_mmx;
  aom_usec_timer timer;
  
  src_ptr = input(this);
  puVar9 = output(this);
  uVar10 = (anonymous_namespace)::ConvolveTestBase::ref8_;
  if (this->UUT_->use_highbd_ != 0) {
    uVar10 = (anonymous_namespace)::ConvolveTestBase::ref16_ >> 1;
  }
  prng.random_.state_ = (Random)0xbaba;
  pPVar11 = testing::
            WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
            ::GetParam();
  if (0 < (pPVar11->
          super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>).
          super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>.
          super__Head_base<1UL,_int,_false>._M_head_impl) {
    lVar12 = (long)puVar9 * 2;
    lVar20 = 0;
    puVar16 = puVar9;
    do {
      pPVar11 = testing::
                WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
                ::GetParam();
      puVar9 = puVar16;
      if (0 < *(int *)&(pPVar11->
                       super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                       ).
                       super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                       .field_0xc) {
        uVar17 = (ulong)((uint)lVar20 << 9);
        lVar18 = (ulong)((uint)lVar20 & 0x7fffff) * 0x400;
        lVar19 = 0;
        do {
          if ((this->UUT_->use_highbd_ & 0xfffffff7U) == 0) {
            uVar8 = testing::internal::Random::Generate(&prng.random_,0x80000000);
            bVar13 = (byte)(uVar8 >> 0x17);
            bVar5 = bVar13 << 4;
            if ((char)bVar13 < '\0') {
              bVar5 = bVar13 >> 4;
            }
            uVar7 = (ushort)bVar5;
          }
          else {
            uVar8 = testing::internal::Random::Generate(&prng.random_,0x80000000);
            uVar7 = (ushort)(uVar8 >> 0xf) & (ushort)this->mask_;
          }
          if (this->UUT_->use_highbd_ == 0) {
            puVar16[lVar19 + uVar17] = (uint8_t)uVar7;
            if (this->UUT_->use_highbd_ != 0) goto LAB_0046a4f2;
            *(uint8_t *)(uVar10 + uVar17 + lVar19) = (uint8_t)uVar7;
          }
          else {
            *(ushort *)(lVar18 + lVar12 + lVar19 * 2) = uVar7;
LAB_0046a4f2:
            *(ushort *)(uVar10 * 2 + lVar18 + lVar19 * 2) = uVar7;
          }
          lVar19 = lVar19 + 1;
          pPVar11 = testing::
                    WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
                    ::GetParam();
        } while (lVar19 < *(int *)&(pPVar11->
                                   super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                                   ).
                                   super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                                   .field_0xc);
      }
      lVar20 = lVar20 + 1;
      pPVar11 = testing::
                WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
                ::GetParam();
      puVar16 = puVar9;
    } while (lVar20 < (pPVar11->
                      super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                      ).
                      super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>.
                      super__Head_base<1UL,_int,_false>._M_head_impl);
  }
  pPVar11 = testing::
            WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
            ::GetParam();
  uVar15 = *(uint *)&(pPVar11->
                     super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                     ).super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                     .field_0xc;
  uVar10 = (ulong)uVar15;
  output_height_00 = 0x46a53c;
  pPVar11 = testing::
            WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
            ::GetParam();
  output_width = (pPVar11->
                 super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>)
                 .super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>.
                 super__Head_base<1UL,_int,_false>._M_head_impl;
  output_height = this->UUT_->use_highbd_;
  if (output_height == 0) {
    filter_block2d_8_c(src_ptr,0xc03910,av1_sub_pel_filters_8smooth[1],(int16_t *)&timer,
                       (uint8_t *)0x80,uVar15,output_width,output_height_00);
    if (output_width != 0) {
      iVar14 = 0;
      uVar15 = 0;
      puVar16 = puVar9;
      do {
        if (uVar10 != 0) {
          uVar17 = 0;
          do {
            puVar16[uVar17] =
                 (uint8_t)((uint)puVar16[uVar17] +
                           (uint)*(byte *)((long)&timer.begin.tv_sec +
                                          (ulong)(uint)(iVar14 + (int)uVar17)) + 1 >> 1);
            uVar17 = uVar17 + 1;
          } while (uVar10 != uVar17);
        }
        puVar16 = puVar16 + 0x200;
        uVar15 = uVar15 + 1;
        iVar14 = iVar14 + 0x80;
      } while (uVar15 != output_width);
    }
  }
  else {
    highbd_filter_block2d_8_c
              ((uint16_t *)((long)src_ptr * 2),0xc03910,av1_sub_pel_filters_8smooth[1],
               (int16_t *)&timer,(uint16_t *)0x80,uVar15,output_width,output_height,(int)puVar9);
    if (output_width != 0) {
      lVar12 = (long)puVar9 * 2;
      iVar14 = 0;
      uVar15 = 0;
      do {
        if (uVar10 != 0) {
          uVar17 = 0;
          do {
            *(short *)(lVar12 + uVar17 * 2) =
                 (short)((uint)*(ushort *)(lVar12 + uVar17 * 2) +
                         (uint)*(ushort *)
                                ((long)&timer.begin.tv_sec + (ulong)(uint)(iVar14 + (int)uVar17) * 2
                                ) + 1 >> 1);
            uVar17 = uVar17 + 1;
          } while (uVar10 != uVar17);
        }
        lVar12 = lVar12 + 0x400;
        uVar15 = uVar15 + 1;
        iVar14 = iVar14 + 0x80;
      } while (uVar15 != output_width);
    }
  }
  gettimeofday((timeval *)&timer,(__timezone_ptr_t)0x0);
  uVar15 = 1000;
  do {
    lVar12 = 0;
    do {
      piVar1 = av1_interp_filter_params_list[lVar12].filter_ptr;
      lVar20 = 0;
      do {
        lVar18 = 0;
        do {
          uVar6 = reg_check_mmx.pre_fpu_env_._12_8_;
          if (lVar20 == 0 || lVar18 == 0) {
            reg_check_mmx.pre_fpu_env_._12_6_ = SUB86(in_FPUInstructionPointer,0);
            if (lVar18 == 0) {
              if (lVar20 != 0) {
                reg_check_mmx.pre_fpu_env_[9] = in_FPULastInstructionOpcode;
                p_Var2 = this->UUT_->h8_;
                pPVar11 = testing::
                          WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
                          ::GetParam();
                iVar14 = *(int *)&(pPVar11->
                                  super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                                  ).
                                  super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                                  .field_0xc;
                pPVar11 = testing::
                          WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
                          ::GetParam();
                (*p_Var2)(src_ptr,0x200,puVar9,0x200,piVar1 + lVar20 * 8,0x10,
                          (int16_t *)(anonymous_namespace)::kInvalidFilter,0x10,iVar14,
                          (pPVar11->
                          super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                          ).
                          super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                          .super__Head_base<1UL,_int,_false>._M_head_impl);
                libaom_test::RegisterStateCheckMMX::Check(&reg_check_mmx);
                uVar6 = reg_check_mmx.pre_fpu_env_._12_8_;
              }
            }
            else {
              reg_check_mmx.pre_fpu_env_[9] = in_FPULastInstructionOpcode;
              p_Var2 = this->UUT_->v8_;
              pPVar11 = testing::
                        WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
                        ::GetParam();
              iVar14 = *(int *)&(pPVar11->
                                super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                                ).
                                super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                                .field_0xc;
              pPVar11 = testing::
                        WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
                        ::GetParam();
              (*p_Var2)(src_ptr,0x200,puVar9,0x200,(int16_t *)(anonymous_namespace)::kInvalidFilter,
                        0x10,(int16_t *)((long)piVar1 + lVar18),0x10,iVar14,
                        (pPVar11->
                        super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                        ).
                        super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                        .super__Head_base<1UL,_int,_false>._M_head_impl);
              libaom_test::RegisterStateCheckMMX::Check(&reg_check_mmx);
              uVar6 = reg_check_mmx.pre_fpu_env_._12_8_;
            }
          }
          reg_check_mmx.pre_fpu_env_._12_8_ = uVar6;
          lVar18 = lVar18 + 0x10;
        } while (lVar18 != 0x100);
        lVar20 = lVar20 + 1;
      } while (lVar20 != 0x10);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    bVar3 = 1 < uVar15;
    uVar15 = uVar15 - 1;
  } while (bVar3);
  gettimeofday((timeval *)&timer.end,(__timezone_ptr_t)0x0);
  lVar20 = timer.end.tv_usec - timer.begin.tv_usec;
  lVar12 = lVar20 + 1000000;
  if (-1 < lVar20) {
    lVar12 = lVar20;
  }
  auVar4 = SEXT816(((lVar20 >> 0x3f) + (timer.end.tv_sec - timer.begin.tv_sec)) * 1000000 + lVar12)
           * SEXT816(0x20c49ba5e353f7cf);
  pPVar11 = testing::
            WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
            ::GetParam();
  uVar15 = *(uint *)&(pPVar11->
                     super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                     ).super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                     .field_0xc;
  pPVar11 = testing::
            WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
            ::GetParam();
  printf("%dx%d (bitdepth %d) time: %5d ms\n",(ulong)uVar15,
         (ulong)(uint)(pPVar11->
                      super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                      ).
                      super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>.
                      super__Head_base<1UL,_int,_false>._M_head_impl,
         (ulong)(uint)this->UUT_->use_highbd_,
         (ulong)(uint)((int)(auVar4._8_8_ >> 7) - (auVar4._12_4_ >> 0x1f)));
  return;
}

Assistant:

void SpeedTest() {
    uint8_t *const in = input();
    uint8_t *const out = output();
    uint8_t *ref;
    if (UUT_->use_highbd_ == 0) {
      ref = ref8_;
    } else {
      ref = CONVERT_TO_BYTEPTR(ref16_);
    }

    // Populate ref and out with some random data
    ::libaom_test::ACMRandom prng;
    for (int y = 0; y < Height(); ++y) {
      for (int x = 0; x < Width(); ++x) {
        uint16_t r;
        if (UUT_->use_highbd_ == 0 || UUT_->use_highbd_ == 8) {
          r = prng.Rand8Extremes();
        } else {
          r = prng.Rand16() & mask_;
        }
        assign_val(out, y * kOutputStride + x, r);
        assign_val(ref, y * kOutputStride + x, r);
      }
    }

    InterpFilter filter = (InterpFilter)1;
    const InterpKernel *filters =
        (const InterpKernel *)av1_get_interp_filter_kernel(filter, USE_8_TAPS);
    wrapper_filter_average_block2d_8_c(in, kInputStride, filters[1], filters[1],
                                       out, kOutputStride, Width(), Height());

    aom_usec_timer timer;
    int tests_num = 1000;

    aom_usec_timer_start(&timer);
    while (tests_num > 0) {
      for (int filter_bank = 0; filter_bank < kNumFilterBanks; ++filter_bank) {
        filter = (InterpFilter)filter_bank;
        filters = (const InterpKernel *)av1_get_interp_filter_kernel(
            filter, USE_8_TAPS);
        for (int filter_x = 0; filter_x < kNumFilters; ++filter_x) {
          for (int filter_y = 0; filter_y < kNumFilters; ++filter_y) {
            if (filter_x && filter_y) continue;
            if (filter_y)
              API_REGISTER_STATE_CHECK(UUT_->v8_(
                  in, kInputStride, out, kOutputStride, kInvalidFilter, 16,
                  filters[filter_y], 16, Width(), Height()));
            else if (filter_x)
              API_REGISTER_STATE_CHECK(UUT_->h8_(
                  in, kInputStride, out, kOutputStride, filters[filter_x], 16,
                  kInvalidFilter, 16, Width(), Height()));
          }
        }
      }
      tests_num--;
    }
    aom_usec_timer_mark(&timer);

    const int elapsed_time =
        static_cast<int>(aom_usec_timer_elapsed(&timer) / 1000);
    printf("%dx%d (bitdepth %d) time: %5d ms\n", Width(), Height(),
           UUT_->use_highbd_, elapsed_time);
  }